

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFontScaler_p.h
# Opt level: O3

void __thiscall KDReports::FontScaler::~FontScaler(FontScaler *this)

{
  QFontMetricsF::~QFontMetricsF(&this->m_initialFontMetrics);
  QFontMetricsF::~QFontMetricsF(&this->m_fontMetrics);
  QFont::~QFont(&this->m_font);
  return;
}

Assistant:

class KDREPORTS_EXPORT FontScaler
{
public:
    explicit FontScaler(const QFont &initialFont);

    void setFontAndScalingFactor(const QFont &font, qreal scalingFactor);

    void setFactorForHeight(qreal wantedHeight);
    void setFactorForWidth(qreal wantedFactor, const QString &sampleText);
    void applyAdditionalScalingFactor(qreal factor);

    QFont font() const
    {
        return m_font;
    }
    QFontMetricsF fontMetrics() const
    {
        return m_fontMetrics;
    }
    qreal scalingFactor() const
    {
        return m_scalingFactor;
    }
    QFontMetricsF initialFontMetrics() const
    {
        return m_initialFontMetrics;
    }
    qreal textWidth(const QString &text) const;

private:
    QFont m_font;
    QFontMetricsF m_fontMetrics;
    QFontMetricsF m_initialFontMetrics;
    qreal m_scalingFactor;
}